

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_putcdata(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  TVar1 = recff_sbufx_write(J,TVar1);
  TVar2 = lj_crecord_topcvoid(J,J->base[1],rd->argv + 1);
  TVar3 = recff_sbufx_checkint(J,rd,2);
  TVar1 = lj_ir_call(J,IRCALL_lj_buf_putmem,(ulong)TVar1,(ulong)TVar2,(ulong)TVar3);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
  lj_opt_fold(J);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_putcdata(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr = lj_crecord_topcvoid(J, J->base[1], &rd->argv[1]);
  TRef len = recff_sbufx_checkint(J, rd, 2);
  trbuf = lj_ir_call(J, IRCALL_lj_buf_putmem, trbuf, tr, len);
  emitir(IRT(IR_USE, IRT_NIL), trbuf, 0);
}